

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void __thiscall Moc::parseSlots(Moc *this,ClassDef *def,Access access)

{
  qsizetype *pqVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  QTypeRevision QVar5;
  Token TVar6;
  uint uVar7;
  uint uVar8;
  long in_FS_OFFSET;
  FunctionDef local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = Parser::test(&this->super_Parser,Q_REVISION_TOKEN);
  uVar7 = 0xff;
  uVar8 = 0xff;
  if (bVar4) {
    QVar5 = parseRevision(this);
    uVar7 = (uint)QVar5.m_majorVersion;
    uVar8 = (uint)(ushort)QVar5;
  }
  Parser::next(&this->super_Parser,COLON);
  while( true ) {
    while( true ) {
      do {
        lVar2 = (this->super_Parser).index;
        if (((lVar2 <= (def->super_BaseDef).begin) || ((def->super_BaseDef).end + -1 <= lVar2)) ||
           ((this->super_Parser).symbols.d.size <= lVar2)) goto LAB_00117467;
        TVar6 = Parser::next(&this->super_Parser);
      } while (TVar6 == SEMIC);
      if (TVar6 != FRIEND) break;
      until(this,SEMIC);
    }
    if ((TVar6 - PRIVATE < 3) || (TVar6 - Q_SIGNALS_TOKEN < 2)) break;
    if (TVar6 == USING) {
      Parser::error(&this->super_Parser,"\'using\' directive not supported in \'slots\' section");
    }
    pqVar1 = &(this->super_Parser).index;
    *pqVar1 = *pqVar1 + -1;
    local_108.type.name.d.d = (Data *)0x0;
    local_108.type.name.d.ptr = (char *)0x0;
    local_108.type.name.d.size = 0;
    local_108.type.rawName.d.d = (Data *)0x0;
    local_108.type.rawName.d.ptr = (char *)0x0;
    local_108.type.rawName.d.size = 0;
    local_108.type._48_4_ = 0xaaaaaaa8;
    local_108.type.typeTag.super_QFlagsStorageHelper<TypeTag,_4>.super_QFlagsStorage<TypeTag>.i =
         (QFlagsStorageHelper<TypeTag,_4>)0xaaaaaaaa;
    memset(&local_108.type.typeTag,0,0x9c);
    local_108.access = access;
    bVar4 = parseFunction(this,&local_108,false);
    if (bVar4) {
      uVar3 = local_108.revision;
      if ((0 < local_108.revision) ||
         (uVar3 = uVar8 & 0xff | uVar7 << 8, (byte)((byte)uVar7 & (byte)uVar8) != 0xff)) {
        local_108.revision = uVar3;
        def->revisionedMethods = def->revisionedMethods + 1;
      }
      QList<FunctionDef>::emplaceBack<FunctionDef_const&>(&def->slotList,&local_108);
      handleDefaultArguments(&def->slotList,&local_108);
    }
    FunctionDef::~FunctionDef(&local_108);
  }
  pqVar1 = &(this->super_Parser).index;
  *pqVar1 = *pqVar1 + -1;
LAB_00117467:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parseSlots(ClassDef *def, FunctionDef::Access access)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'slots' section");
        default:
            prev();
        }

        FunctionDef funcDef;
        funcDef.access = access;
        if (!parseFunction(&funcDef))
            continue;
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->slotList += funcDef;
        handleDefaultArguments(&def->slotList, funcDef);
    }
}